

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_glyph_interpolate_other_points(PSH_Glyph glyph,FT_Int dimension)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  PSH_Point pPVar4;
  FT_Long FVar5;
  PSH_Point pPVar6;
  PSH_Point pPVar7;
  PSH_Point pPVar8;
  long lVar9;
  int iVar10;
  FT_UInt FVar11;
  long lVar12;
  long b_;
  PSH_Point pPVar13;
  uint uVar14;
  FT_Fixed FVar15;
  PSH_Contour pPVar16;
  uint uVar17;
  long lVar18;
  PSH_Point pPVar19;
  long lVar20;
  
  FVar11 = glyph->num_contours;
  if (FVar11 != 0) {
    pPVar16 = glyph->contours;
    FVar15 = glyph->globals->dimension[(uint)dimension].scale_delta;
    lVar18 = (long)(int)glyph->globals->dimension[(uint)dimension].scale_mult;
    do {
      uVar1 = pPVar16->count;
      if ((ulong)uVar1 != 0) {
        pPVar7 = pPVar16->start;
        pPVar4 = pPVar7 + uVar1;
        uVar14 = 0;
        pPVar6 = pPVar7;
        pPVar8 = (PSH_Point)0x0;
        do {
          uVar17 = pPVar6->flags2 & 0x20;
          pPVar19 = pPVar8;
          if (pPVar8 == (PSH_Point)0x0) {
            pPVar19 = pPVar6;
          }
          if (uVar17 == 0) {
            pPVar19 = pPVar8;
          }
          uVar14 = uVar14 + (uVar17 >> 5);
          pPVar6 = pPVar6 + 1;
          pPVar8 = pPVar19;
        } while (pPVar6 < pPVar4);
        pPVar6 = pPVar19;
        if (uVar14 < 2) {
          if (uVar14 == 1) {
            lVar3 = (int)pPVar19->org_u * lVar18;
            FVar15 = pPVar19->cur_u - (long)(int)((ulong)(lVar3 + (lVar3 >> 0x3f) + 0x8000) >> 0x10)
            ;
          }
          if (uVar1 != 0) {
            do {
              if (pPVar7 != pPVar19) {
                lVar3 = (int)pPVar7->org_u * lVar18;
                pPVar7->cur_u = (int)((ulong)(lVar3 + (lVar3 >> 0x3f) + 0x8000) >> 0x10) + FVar15;
              }
              pPVar7 = pPVar7 + 1;
            } while (pPVar7 < pPVar4);
          }
        }
        else {
          do {
            do {
              pPVar4 = pPVar6;
              pPVar6 = pPVar4->next;
              if (pPVar6 == pPVar19) goto LAB_00212690;
              pPVar7 = pPVar6;
            } while ((pPVar6->flags2 & 0x20) != 0);
            do {
              pPVar7 = pPVar7->next;
            } while ((pPVar7->flags2 & 0x20) == 0);
            lVar3 = pPVar4->org_u;
            lVar20 = pPVar7->org_u;
            b_ = lVar3 - lVar20;
            pPVar8 = pPVar4;
            pPVar13 = pPVar7;
            if (b_ == 0 || lVar3 < lVar20) {
              b_ = lVar20 - lVar3;
              pPVar8 = pPVar7;
              pPVar13 = pPVar4;
              lVar20 = lVar3;
            }
            lVar3 = pPVar13->cur_u;
            lVar2 = pPVar8->cur_u;
            if (b_ < 1) {
              lVar9 = 0x10000;
            }
            else {
              FVar5 = FT_DivFix(lVar2 - lVar3,b_);
              lVar9 = (long)(int)FVar5;
              pPVar6 = pPVar4->next;
            }
            do {
              lVar12 = pPVar6->org_u - lVar20;
              iVar10 = (int)lVar12;
              if (lVar12 == 0 || pPVar6->org_u < lVar20) {
                lVar12 = iVar10 * lVar18;
LAB_0021262b:
                lVar12 = (int)((ulong)(lVar12 + (lVar12 >> 0x3f) + 0x8000) >> 0x10) + lVar3;
              }
              else {
                if (lVar12 < b_) {
                  lVar12 = iVar10 * lVar9;
                  goto LAB_0021262b;
                }
                lVar12 = (iVar10 - (int)b_) * lVar18;
                lVar12 = (int)((ulong)(lVar12 + (lVar12 >> 0x3f) + 0x8000) >> 0x10) + lVar2;
              }
              pPVar6->cur_u = lVar12;
              pPVar6 = pPVar6->next;
            } while (pPVar6 != pPVar7);
            pPVar6 = pPVar7;
          } while (pPVar7 != pPVar19);
        }
      }
LAB_00212690:
      pPVar16 = pPVar16 + 1;
      FVar11 = FVar11 - 1;
    } while (FVar11 != 0);
  }
  return;
}

Assistant:

static void
  psh_glyph_interpolate_other_points( PSH_Glyph  glyph,
                                      FT_Int     dimension )
  {
    PSH_Dimension  dim          = &glyph->globals->dimension[dimension];
    FT_Fixed       scale        = dim->scale_mult;
    FT_Fixed       delta        = dim->scale_delta;
    PSH_Contour    contour      = glyph->contours;
    FT_UInt        num_contours = glyph->num_contours;


    for ( ; num_contours > 0; num_contours--, contour++ )
    {
      PSH_Point  start = contour->start;
      PSH_Point  first, next, point;
      FT_UInt    fit_count;


      /* count the number of strong points in this contour */
      next      = start + contour->count;
      fit_count = 0;
      first     = NULL;

      for ( point = start; point < next; point++ )
        if ( psh_point_is_fitted( point ) )
        {
          if ( !first )
            first = point;

          fit_count++;
        }

      /* if there are less than 2 fitted points in the contour, we */
      /* simply scale and eventually translate the contour points  */
      if ( fit_count < 2 )
      {
        if ( fit_count == 1 )
          delta = first->cur_u - FT_MulFix( first->org_u, scale );

        for ( point = start; point < next; point++ )
          if ( point != first )
            point->cur_u = FT_MulFix( point->org_u, scale ) + delta;

        goto Next_Contour;
      }

      /* there are more than 2 strong points in this contour; we */
      /* need to interpolate weak points between them            */
      start = first;
      do
      {
        /* skip consecutive fitted points */
        for (;;)
        {
          next = first->next;
          if ( next == start )
            goto Next_Contour;

          if ( !psh_point_is_fitted( next ) )
            break;

          first = next;
        }

        /* find next fitted point after unfitted one */
        for (;;)
        {
          next = next->next;
          if ( psh_point_is_fitted( next ) )
            break;
        }

        /* now interpolate between them */
        {
          FT_Pos    org_a, org_ab, cur_a, cur_ab;
          FT_Pos    org_c, org_ac, cur_c;
          FT_Fixed  scale_ab;


          if ( first->org_u <= next->org_u )
          {
            org_a  = first->org_u;
            cur_a  = first->cur_u;
            org_ab = next->org_u - org_a;
            cur_ab = next->cur_u - cur_a;
          }
          else
          {
            org_a  = next->org_u;
            cur_a  = next->cur_u;
            org_ab = first->org_u - org_a;
            cur_ab = first->cur_u - cur_a;
          }

          scale_ab = 0x10000L;
          if ( org_ab > 0 )
            scale_ab = FT_DivFix( cur_ab, org_ab );

          point = first->next;
          do
          {
            org_c  = point->org_u;
            org_ac = org_c - org_a;

            if ( org_ac <= 0 )
            {
              /* on the left of the interpolation zone */
              cur_c = cur_a + FT_MulFix( org_ac, scale );
            }
            else if ( org_ac >= org_ab )
            {
              /* on the right on the interpolation zone */
              cur_c = cur_a + cur_ab + FT_MulFix( org_ac - org_ab, scale );
            }
            else
            {
              /* within the interpolation zone */
              cur_c = cur_a + FT_MulFix( org_ac, scale_ab );
            }

            point->cur_u = cur_c;

            point = point->next;

          } while ( point != next );
        }

        /* keep going until all points in the contours have been processed */
        first = next;

      } while ( first != start );

    Next_Contour:
      ;
    }
  }